

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::ReallocForNuma(TPZSkylMatrix<std::complex<float>_> *this)

{
  complex<float> *pcVar1;
  long lVar2;
  complex<float> *pcVar3;
  complex<float> **ppcVar4;
  long lVar5;
  
  TPZVec<std::complex<float>_*>::ReallocForNuma(&this->fElem);
  pcVar1 = (this->fStorage).fStore;
  TPZVec<std::complex<float>_>::ReallocForNuma(&this->fStorage);
  lVar2 = (this->fElem).fNElements;
  if (0 < lVar2) {
    pcVar3 = (this->fStorage).fStore;
    lVar5 = 0;
    do {
      ppcVar4 = (this->fElem).fStore;
      ppcVar4[lVar5] = (complex<float> *)(((long)ppcVar4[lVar5] - (long)pcVar1) + (long)pcVar3);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

void ReallocForNuma() {
        fElem.ReallocForNuma();
        TVar* old_start = &fStorage[0];
        fStorage.ReallocForNuma();
        TVar* new_start = &fStorage[0];
        for (int i=0; i<fElem.size(); i++) {
            fElem[i] = new_start + (fElem[i]-old_start);
        }
	}